

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

void __thiscall
Reducer::tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::
FunctionReferenceRemover::visitRefFunc(wasm::RefFunc__(void *this,RefFunc *curr)

{
  size_type sVar1;
  Expression *expression;
  Builder local_20;
  
  sVar1 = std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)((long)this + 0xd8),&curr->func);
  if (sVar1 != 0) {
    local_20.wasm = *(Module **)((long)this + 0xd0);
    expression = wasm::Builder::replaceWithIdenticalType<wasm::RefFunc>(&local_20,curr);
    wasm::Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>::
    replaceCurrent((Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                    *)this,expression);
  }
  return;
}

Assistant:

void visitRefFunc(RefFunc* curr) {
        if (names.count(curr->func)) {
          replaceCurrent(Builder(*getModule()).replaceWithIdenticalType(curr));
        }
      }